

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

void Pln_ManPrintFinal(Pln_Man_t *p,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int i;
  uint uVar7;
  uint uVar8;
  
  uVar8 = 0;
  for (i = 0; i < p->vCoefs->nSize; i = i + 1) {
    iVar4 = Vec_IntEntry(p->vCoefs,i);
    if ((iVar4 != 0) &&
       (uVar7 = uVar8 + 1, bVar1 = (int)uVar8 < 0x19, uVar8 = uVar7, bVar1 && fVerbose != 0)) {
      pVVar6 = Hsh_VecReadEntry(p->pHashC,iVar4);
      for (iVar4 = 0; iVar4 < pVVar6->nSize; iVar4 = iVar4 + 1) {
        iVar5 = Vec_IntEntry(pVVar6,iVar4);
        pcVar3 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
        if (iVar5 < 0) {
          pcVar3 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
        }
        iVar2 = -iVar5;
        if (0 < iVar5) {
          iVar2 = iVar5;
        }
        printf("%s%d",pcVar3 + 0x4a,(ulong)(uint)(1 << ((char)iVar2 - 1U & 0x1f)));
      }
      pVVar6 = Hsh_VecReadEntry(p->pHashM,i);
      for (iVar4 = 0; iVar4 < pVVar6->nSize; iVar4 = iVar4 + 1) {
        uVar7 = Vec_IntEntry(pVVar6,iVar4);
        printf(" * %d",(ulong)uVar7);
      }
      putchar(10);
    }
  }
  printf("HashC = %d. HashM = %d.  Total = %d. Used = %d.\n",(ulong)(uint)p->pHashC->vMap->nSize,
         (ulong)(uint)p->pHashM->vMap->nSize,(ulong)(uint)p->nBuilds,(ulong)uVar8);
  return;
}

Assistant:

void Pln_ManPrintFinal( Pln_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vArray;
    int k, Entry, iMono, iConst, Count = 0;
    Vec_IntForEachEntry( p->vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;

        Count++;

        if ( !fVerbose )
            continue;

        if ( Count > 25 )
            continue;

        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( "%s%d", Entry < 0 ? "-" : "+", (1 << (Abc_AbsInt(Entry)-1)) );

        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( " * %d", Entry );
        printf( "\n" );
    }
    printf( "HashC = %d. HashM = %d.  Total = %d. Used = %d.\n", Hsh_VecSize(p->pHashC), Hsh_VecSize(p->pHashM), p->nBuilds, Count );
}